

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.h
# Opt level: O1

void __thiscall spvtools::opt::IRContext::~IRContext(IRContext *this)

{
  LivenessManager *pLVar1;
  StructuredCFGAnalysis *__ptr;
  InstructionFolder *__ptr_00;
  ValueNumberTable *this_00;
  ScalarEvolutionAnalysis *__ptr_01;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_std::_Select1st<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>
  *this_01;
  DebugInfoManager *__ptr_02;
  TypeManager *__ptr_03;
  ConstantManager *__ptr_04;
  FeatureManager *__ptr_05;
  DefUseManager *__ptr_06;
  _Manager_type p_Var2;
  
  spvContextDestroy(this->syntax_context_);
  pLVar1 = (this->liveness_mgr_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::analysis::LivenessManager,_std::default_delete<spvtools::opt::analysis::LivenessManager>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::analysis::LivenessManager_*,_std::default_delete<spvtools::opt::analysis::LivenessManager>_>
           .super__Head_base<0UL,_spvtools::opt::analysis::LivenessManager_*,_false>._M_head_impl;
  if (pLVar1 != (LivenessManager *)0x0) {
    std::
    _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&(pLVar1->live_builtins_)._M_h);
    std::
    _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&(pLVar1->live_locs_)._M_h);
    operator_delete(pLVar1,0x80);
  }
  (this->liveness_mgr_)._M_t.
  super___uniq_ptr_impl<spvtools::opt::analysis::LivenessManager,_std::default_delete<spvtools::opt::analysis::LivenessManager>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::analysis::LivenessManager_*,_std::default_delete<spvtools::opt::analysis::LivenessManager>_>
  .super__Head_base<0UL,_spvtools::opt::analysis::LivenessManager_*,_false>._M_head_impl =
       (LivenessManager *)0x0;
  __ptr = (this->struct_cfg_analysis_)._M_t.
          super___uniq_ptr_impl<spvtools::opt::StructuredCFGAnalysis,_std::default_delete<spvtools::opt::StructuredCFGAnalysis>_>
          ._M_t.
          super__Tuple_impl<0UL,_spvtools::opt::StructuredCFGAnalysis_*,_std::default_delete<spvtools::opt::StructuredCFGAnalysis>_>
          .super__Head_base<0UL,_spvtools::opt::StructuredCFGAnalysis_*,_false>._M_head_impl;
  if (__ptr != (StructuredCFGAnalysis *)0x0) {
    std::default_delete<spvtools::opt::StructuredCFGAnalysis>::operator()
              ((default_delete<spvtools::opt::StructuredCFGAnalysis> *)&this->struct_cfg_analysis_,
               __ptr);
  }
  (this->struct_cfg_analysis_)._M_t.
  super___uniq_ptr_impl<spvtools::opt::StructuredCFGAnalysis,_std::default_delete<spvtools::opt::StructuredCFGAnalysis>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::StructuredCFGAnalysis_*,_std::default_delete<spvtools::opt::StructuredCFGAnalysis>_>
  .super__Head_base<0UL,_spvtools::opt::StructuredCFGAnalysis_*,_false>._M_head_impl =
       (StructuredCFGAnalysis *)0x0;
  __ptr_00 = (this->inst_folder_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::InstructionFolder,_std::default_delete<spvtools::opt::InstructionFolder>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::InstructionFolder_*,_std::default_delete<spvtools::opt::InstructionFolder>_>
             .super__Head_base<0UL,_spvtools::opt::InstructionFolder_*,_false>._M_head_impl;
  if (__ptr_00 != (InstructionFolder *)0x0) {
    std::default_delete<spvtools::opt::InstructionFolder>::operator()
              ((default_delete<spvtools::opt::InstructionFolder> *)&this->inst_folder_,__ptr_00);
  }
  (this->inst_folder_)._M_t.
  super___uniq_ptr_impl<spvtools::opt::InstructionFolder,_std::default_delete<spvtools::opt::InstructionFolder>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::InstructionFolder_*,_std::default_delete<spvtools::opt::InstructionFolder>_>
  .super__Head_base<0UL,_spvtools::opt::InstructionFolder_*,_false>._M_head_impl =
       (InstructionFolder *)0x0;
  this_00 = (this->vn_table_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::ValueNumberTable,_std::default_delete<spvtools::opt::ValueNumberTable>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::ValueNumberTable_*,_std::default_delete<spvtools::opt::ValueNumberTable>_>
            .super__Head_base<0UL,_spvtools::opt::ValueNumberTable_*,_false>._M_head_impl;
  if (this_00 != (ValueNumberTable *)0x0) {
    std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&(this_00->id_to_value_)._M_h);
    std::
    _Hashtable<spvtools::opt::Instruction,_std::pair<const_spvtools::opt::Instruction,_unsigned_int>,_std::allocator<std::pair<const_spvtools::opt::Instruction,_unsigned_int>_>,_std::__detail::_Select1st,_spvtools::opt::ComputeSameValue,_spvtools::opt::ValueTableHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<spvtools::opt::Instruction,_std::pair<const_spvtools::opt::Instruction,_unsigned_int>,_std::allocator<std::pair<const_spvtools::opt::Instruction,_unsigned_int>_>,_std::__detail::_Select1st,_spvtools::opt::ComputeSameValue,_spvtools::opt::ValueTableHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)this_00);
    operator_delete(this_00,0x80);
  }
  (this->vn_table_)._M_t.
  super___uniq_ptr_impl<spvtools::opt::ValueNumberTable,_std::default_delete<spvtools::opt::ValueNumberTable>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::ValueNumberTable_*,_std::default_delete<spvtools::opt::ValueNumberTable>_>
  .super__Head_base<0UL,_spvtools::opt::ValueNumberTable_*,_false>._M_head_impl =
       (ValueNumberTable *)0x0;
  std::
  unique_ptr<spvtools::opt::LivenessAnalysis,_std::default_delete<spvtools::opt::LivenessAnalysis>_>
  ::~unique_ptr(&this->reg_pressure_);
  __ptr_01 = (this->scalar_evolution_analysis_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::ScalarEvolutionAnalysis,_std::default_delete<spvtools::opt::ScalarEvolutionAnalysis>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::ScalarEvolutionAnalysis_*,_std::default_delete<spvtools::opt::ScalarEvolutionAnalysis>_>
             .super__Head_base<0UL,_spvtools::opt::ScalarEvolutionAnalysis_*,_false>._M_head_impl;
  if (__ptr_01 != (ScalarEvolutionAnalysis *)0x0) {
    std::default_delete<spvtools::opt::ScalarEvolutionAnalysis>::operator()
              ((default_delete<spvtools::opt::ScalarEvolutionAnalysis> *)
               &this->scalar_evolution_analysis_,__ptr_01);
  }
  (this->scalar_evolution_analysis_)._M_t.
  super___uniq_ptr_impl<spvtools::opt::ScalarEvolutionAnalysis,_std::default_delete<spvtools::opt::ScalarEvolutionAnalysis>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::ScalarEvolutionAnalysis_*,_std::default_delete<spvtools::opt::ScalarEvolutionAnalysis>_>
  .super__Head_base<0UL,_spvtools::opt::ScalarEvolutionAnalysis_*,_false>._M_head_impl =
       (ScalarEvolutionAnalysis *)0x0;
  this_01 = &((this->id_to_name_)._M_t.
              super___uniq_ptr_impl<std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>,_std::default_delete<std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>_*,_std::default_delete<std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>_>_>
              .
              super__Head_base<0UL,_std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>_*,_false>
             ._M_head_impl)->_M_t;
  if (this_01 !=
      (_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_std::_Select1st<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>
       *)0x0) {
    std::
    _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_std::_Select1st<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>
    ::_M_erase(this_01,*(_Link_type *)((long)&(this_01->_M_impl).super__Rb_tree_header + 8));
    operator_delete(this_01,0x30);
  }
  (this->id_to_name_)._M_t.
  super___uniq_ptr_impl<std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>,_std::default_delete<std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>_*,_std::default_delete<std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>_>_>
  .
  super__Head_base<0UL,_std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>_*,_false>
  ._M_head_impl =
       (multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>
        *)0x0;
  __ptr_02 = (this->debug_info_mgr_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::analysis::DebugInfoManager,_std::default_delete<spvtools::opt::analysis::DebugInfoManager>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::analysis::DebugInfoManager_*,_std::default_delete<spvtools::opt::analysis::DebugInfoManager>_>
             .super__Head_base<0UL,_spvtools::opt::analysis::DebugInfoManager_*,_false>._M_head_impl
  ;
  if (__ptr_02 != (DebugInfoManager *)0x0) {
    std::default_delete<spvtools::opt::analysis::DebugInfoManager>::operator()
              ((default_delete<spvtools::opt::analysis::DebugInfoManager> *)&this->debug_info_mgr_,
               __ptr_02);
  }
  (this->debug_info_mgr_)._M_t.
  super___uniq_ptr_impl<spvtools::opt::analysis::DebugInfoManager,_std::default_delete<spvtools::opt::analysis::DebugInfoManager>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::analysis::DebugInfoManager_*,_std::default_delete<spvtools::opt::analysis::DebugInfoManager>_>
  .super__Head_base<0UL,_spvtools::opt::analysis::DebugInfoManager_*,_false>._M_head_impl =
       (DebugInfoManager *)0x0;
  __ptr_03 = (this->type_mgr_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::analysis::TypeManager_*,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
             .super__Head_base<0UL,_spvtools::opt::analysis::TypeManager_*,_false>._M_head_impl;
  if (__ptr_03 != (TypeManager *)0x0) {
    std::default_delete<spvtools::opt::analysis::TypeManager>::operator()
              ((default_delete<spvtools::opt::analysis::TypeManager> *)&this->type_mgr_,__ptr_03);
  }
  (this->type_mgr_)._M_t.
  super___uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::analysis::TypeManager_*,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
  .super__Head_base<0UL,_spvtools::opt::analysis::TypeManager_*,_false>._M_head_impl =
       (TypeManager *)0x0;
  __ptr_04 = (this->constant_mgr_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::analysis::ConstantManager,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::analysis::ConstantManager_*,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
             .super__Head_base<0UL,_spvtools::opt::analysis::ConstantManager_*,_false>._M_head_impl;
  if (__ptr_04 != (ConstantManager *)0x0) {
    std::default_delete<spvtools::opt::analysis::ConstantManager>::operator()
              ((default_delete<spvtools::opt::analysis::ConstantManager> *)&this->constant_mgr_,
               __ptr_04);
  }
  (this->constant_mgr_)._M_t.
  super___uniq_ptr_impl<spvtools::opt::analysis::ConstantManager,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::analysis::ConstantManager_*,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
  .super__Head_base<0UL,_spvtools::opt::analysis::ConstantManager_*,_false>._M_head_impl =
       (ConstantManager *)0x0;
  std::
  _Hashtable<const_spvtools::opt::Function_*,_std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::LoopDescriptor>,_std::allocator<std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::LoopDescriptor>_>,_std::__detail::_Select1st,_std::equal_to<const_spvtools::opt::Function_*>,_std::hash<const_spvtools::opt::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->loop_descriptors_)._M_h);
  std::
  _Rb_tree<const_spvtools::opt::Function_*,_std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::PostDominatorAnalysis>,_std::_Select1st<std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::PostDominatorAnalysis>_>,_std::less<const_spvtools::opt::Function_*>,_std::allocator<std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::PostDominatorAnalysis>_>_>
  ::_M_erase(&(this->post_dominator_trees_)._M_t,
             (_Link_type)
             (this->post_dominator_trees_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  std::
  _Rb_tree<const_spvtools::opt::Function_*,_std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::DominatorAnalysis>,_std::_Select1st<std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::DominatorAnalysis>_>,_std::less<const_spvtools::opt::Function_*>,_std::allocator<std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::DominatorAnalysis>_>_>
  ::_M_erase(&(this->dominator_trees_)._M_t,
             (_Link_type)
             (this->dominator_trees_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  std::unique_ptr<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>::~unique_ptr
            (&this->cfg_);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->builtin_var_id_map_)._M_h);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->combinator_ops_)._M_h);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Function_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Function_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->id_to_func_)._M_h);
  std::
  _Hashtable<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->instr_to_block_)._M_h);
  __ptr_05 = (this->feature_mgr_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
             .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl;
  if (__ptr_05 != (FeatureManager *)0x0) {
    std::default_delete<spvtools::opt::FeatureManager>::operator()
              ((default_delete<spvtools::opt::FeatureManager> *)&this->feature_mgr_,__ptr_05);
  }
  (this->feature_mgr_)._M_t.
  super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
  .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl =
       (FeatureManager *)0x0;
  std::
  unique_ptr<spvtools::opt::analysis::DecorationManager,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
  ::~unique_ptr(&this->decoration_mgr_);
  __ptr_06 = (this->def_use_mgr_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
             .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
  if (__ptr_06 != (DefUseManager *)0x0) {
    std::default_delete<spvtools::opt::analysis::DefUseManager>::operator()
              ((default_delete<spvtools::opt::analysis::DefUseManager> *)&this->def_use_mgr_,
               __ptr_06);
  }
  (this->def_use_mgr_)._M_t.
  super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
  .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl =
       (DefUseManager *)0x0;
  p_Var2 = (this->consumer_).super__Function_base._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    (*p_Var2)((_Any_data *)&this->consumer_,(_Any_data *)&this->consumer_,__destroy_functor);
  }
  std::unique_ptr<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>::~unique_ptr
            (&this->module_);
  return;
}

Assistant:

~IRContext() { spvContextDestroy(syntax_context_); }